

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O3

Result * validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetworkClassifier>
                   (Result *__return_storage_ptr__,ModelDescription *interface,
                   NeuralNetworkClassifier *nn,
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *outputBlobNames,bool isUpdatable,ValidationPolicy *validationPolicy)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  mapped_type mVar7;
  Rep *pRVar8;
  pointer pcVar9;
  void *pvVar10;
  void **ppvVar11;
  RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription> RVar12;
  mapped_type *pmVar13;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this;
  iterator iVar14;
  _Base_ptr p_Var15;
  long lVar16;
  key_type *__k;
  long lVar17;
  undefined1 *puVar18;
  undefined7 in_register_00000081;
  ValidationPolicy *pVVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  Result r;
  NeuralNetworkSpecValidator validator;
  NeuralNetworkShaper shaper;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ioBlobNameToRank;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  inputBlobs;
  pointer local_220;
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  undefined1 local_1f0 [8];
  _Alloc_hider local_1e8;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [72];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_188;
  ValidationPolicy *local_150;
  undefined4 local_144;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_140;
  undefined1 local_118 [8];
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  local_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_60;
  
  local_144 = (undefined4)CONCAT71(in_register_00000081,isUpdatable);
  local_150 = validationPolicy;
  local_140 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)outputBlobNames;
  CoreML::Result::Result((Result *)&local_220);
  pRVar8 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar11 = pRVar8->elements;
  if (pRVar8 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  lVar16 = (long)(interface->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar16 == 0) {
    bVar21 = true;
  }
  else {
    lVar20 = 0;
    do {
      puVar18 = *(undefined1 **)(*(long *)((long)ppvVar11 + lVar20) + 0x20);
      if (puVar18 == (undefined1 *)0x0) {
        puVar18 = CoreML::Specification::_FeatureType_default_instance_;
      }
      bVar21 = *(int *)(puVar18 + 0x24) != 5;
    } while ((bVar21) && (bVar22 = lVar16 * 8 + -8 != lVar20, lVar20 = lVar20 + 8, bVar22));
  }
  iVar4 = nn->arrayinputshapemapping_;
  iVar5 = nn->imageinputshapemapping_;
  bVar22 = iVar5 == 0;
  pRVar8 = (nn->layers_).super_RepeatedPtrFieldBase.rep_;
  ppvVar11 = pRVar8->elements;
  if (pRVar8 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  lVar16 = (long)(nn->layers_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar16 == 0) {
LAB_002fc2df:
    if (bVar21 || (iVar5 == 0 || iVar4 != 0)) {
      uVar6 = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
      if (uVar6 == 0 && local_150->allowsEmptyInput == false) {
        local_1f0 = (undefined1  [8])local_1e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f0,"Neural networks require at least one input.","");
        CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_1f0);
      }
      else if ((interface->output_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        local_1f0 = (undefined1  [8])local_1e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f0,"Neural networks produce at least one output.","");
        CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_1f0);
      }
      else {
        if ((nn->layers_).super_RepeatedPtrFieldBase.current_size_ != 0) {
          if (0 < (int)uVar6) {
            pRVar8 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
            ppvVar11 = pRVar8->elements;
            if (pRVar8 == (Rep *)0x0) {
              ppvVar11 = (void **)0x0;
            }
            RVar12 = std::
                     __find_if<google::protobuf::internal::RepeatedPtrIterator<CoreML::Specification::FeatureDescription_const>,__gnu_cxx::__ops::_Iter_negate<validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetworkClassifier>(CoreML::Specification::ModelDescription_const&,CoreML::Specification::NeuralNetworkClassifier_const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&,bool,CoreML::ValidationPolicy_const&)::_lambda(CoreML::Specification::FeatureDescription_const&)_1_>>
                               (ppvVar11,ppvVar11 + uVar6);
            if (RVar12.it_ == ppvVar11 + uVar6) {
              local_1f0 = (undefined1  [8])local_1e0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1f0,
                         "Neural networks require at least one non-optional input.","");
              CoreML::Result::Result
                        (__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_1f0);
              goto LAB_002fca98;
            }
          }
          local_1f0 = (undefined1  [8])local_1e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"inputs","");
          CoreML::validateInputOutputTypes
                    (__return_storage_ptr__,&interface->input_,MODEL_INPUT_TYPE_INVALID,
                     (string *)local_1f0);
          if (local_1f0 != (undefined1  [8])local_1e0) {
            operator_delete((void *)local_1f0,local_1e0._0_8_ + 1);
          }
          bVar21 = CoreML::Result::good(__return_storage_ptr__);
          if (bVar21) {
            bVar21 = (bool)(iVar4 != 0 | bVar22 ^ 1U);
            pcVar9 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            paVar1 = &(__return_storage_ptr__->m_message).field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar9 != paVar1) {
              operator_delete(pcVar9,paVar1->_M_allocated_capacity + 1);
            }
            local_90._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_90._M_impl.super__Rb_tree_header._M_header;
            local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_1f8 = paVar1;
            local_90._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_90._M_impl.super__Rb_tree_header._M_header._M_left;
            if (bVar21 != false) {
              pRVar8 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
              ppvVar11 = pRVar8->elements;
              if (pRVar8 == (Rep *)0x0) {
                ppvVar11 = (void **)0x0;
              }
              lVar16 = (long)(interface->input_).super_RepeatedPtrFieldBase.current_size_;
              if (lVar16 != 0) {
                lVar20 = 0;
                do {
                  lVar17 = *(long *)((long)ppvVar11 + lVar20);
                  puVar18 = *(undefined1 **)(lVar17 + 0x20);
                  if (puVar18 == (undefined1 *)0x0) {
                    puVar18 = CoreML::Specification::_FeatureType_default_instance_;
                  }
                  if (*(int *)(puVar18 + 0x24) == 4) {
                    __k = (key_type *)(*(ulong *)(lVar17 + 0x10) & 0xfffffffffffffffe);
                    if (nn->imageinputshapemapping_ == 0) {
                      pmVar13 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                              *)&local_90,__k);
LAB_002fc4d4:
                      *pmVar13 = 5;
                    }
                    else {
                      pmVar13 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                              *)&local_90,__k);
                      *pmVar13 = 4;
                    }
                  }
                  else if (*(int *)(puVar18 + 0x24) == 5) {
                    if (nn->arrayinputshapemapping_ == 0) {
                      pmVar13 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                              *)&local_90,
                                             (key_type *)
                                             (*(ulong *)(lVar17 + 0x10) & 0xfffffffffffffffe));
                      goto LAB_002fc4d4;
                    }
                    mVar7 = *(mapped_type *)(*(long *)(puVar18 + 0x18) + 0x10);
                    pmVar13 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                            *)&local_90,
                                           (key_type *)
                                           (*(ulong *)(lVar17 + 0x10) & 0xfffffffffffffffe));
                    *pmVar13 = mVar7;
                  }
                  lVar20 = lVar20 + 8;
                } while (lVar16 * 8 != lVar20);
              }
              pRVar8 = (interface->output_).super_RepeatedPtrFieldBase.rep_;
              ppvVar11 = pRVar8->elements;
              if (pRVar8 == (Rep *)0x0) {
                ppvVar11 = (void **)0x0;
              }
              lVar16 = (long)(interface->output_).super_RepeatedPtrFieldBase.current_size_;
              if (lVar16 != 0) {
                lVar20 = 0;
                do {
                  puVar18 = *(undefined1 **)(*(long *)((long)ppvVar11 + lVar20) + 0x20);
                  if (puVar18 == (undefined1 *)0x0) {
                    puVar18 = CoreML::Specification::_FeatureType_default_instance_;
                  }
                  if ((*(int *)(puVar18 + 0x24) == 5) &&
                     (iVar4 = *(int *)(*(long *)(puVar18 + 0x18) + 0x10), iVar4 != 0)) {
                    pmVar13 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                            *)&local_90,
                                           (key_type *)
                                           (*(ulong *)(*(long *)((long)ppvVar11 + lVar20) + 0x10) &
                                           0xfffffffffffffffe));
                    *pmVar13 = iVar4;
                  }
                  lVar20 = lVar20 + 8;
                } while (lVar16 * 8 != lVar20);
              }
            }
            p_Var2 = &local_60._M_impl.super__Rb_tree_header;
            local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
            pRVar8 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
            pVVar19 = (ValidationPolicy *)pRVar8->elements;
            if (pRVar8 == (Rep *)0x0) {
              pVVar19 = (ValidationPolicy *)0x0;
            }
            lVar16 = (long)(interface->input_).super_RepeatedPtrFieldBase.current_size_;
            local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
            local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
            if (lVar16 != 0) {
              local_150 = pVVar19 + lVar16 * 2;
              do {
                pvVar10 = *(void **)pVVar19;
                local_1f0 = (undefined1  [8])local_1e0;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"__input","");
                this = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                        *)&local_60,
                                       (key_type *)
                                       (*(ulong *)((long)pvVar10 + 0x10) & 0xfffffffffffffffe));
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_assign_unique<std::__cxx11::string_const*>
                          (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1d0);
                if (local_1f0 != (undefined1  [8])local_1e0) {
                  operator_delete((void *)local_1f0,local_1e0._0_8_ + 1);
                }
                puVar18 = *(undefined1 **)((long)pvVar10 + 0x20);
                if (puVar18 == (undefined1 *)0x0) {
                  puVar18 = CoreML::Specification::_FeatureType_default_instance_;
                }
                if (*(int *)(puVar18 + 0x24) == 5) {
                  if (bVar21 == false) {
                    lVar16 = *(long *)(puVar18 + 0x18);
                    uVar6 = *(uint *)(lVar16 + 0x10);
                    if ((0 < (int)uVar6) && ((uVar6 | 2) != 3)) {
                      local_1f0 = (undefined1  [8])local_1e0;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f0,
                                 "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays)."
                                 ,"");
                      CoreML::Result::Result
                                (__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_1f0)
                      ;
LAB_002fcc04:
                      if (local_1f0 != (undefined1  [8])local_1e0) {
                        operator_delete((void *)local_1f0,local_1e0._0_8_ + 1);
                      }
                      goto LAB_002fcb25;
                    }
                    iVar4 = *(int *)(lVar16 + 0x3c);
                    if (iVar4 == 0) {
LAB_002fc6fe:
                      if ((int)uVar6 < 1) {
                        local_1f0 = (undefined1  [8])local_1e0;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_1f0,
                                   "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays)."
                                   ,"");
                        CoreML::Result::Result
                                  (__return_storage_ptr__,INVALID_MODEL_INTERFACE,
                                   (string *)local_1f0);
                        goto LAB_002fcc04;
                      }
                    }
                    else if (iVar4 == 0x1f) {
                      if ((*(uint *)(*(long *)(lVar16 + 0x28) + 0x18) | 2) != 3) goto LAB_002fc6fe;
                    }
                    else if (iVar4 == 0x15) {
                      lVar17 = *(long *)(*(long *)(lVar16 + 0x28) + 0x20);
                      lVar20 = lVar17 + 8;
                      if (lVar17 == 0) {
                        lVar20 = 0;
                      }
                      lVar16 = (long)*(int *)(*(long *)(lVar16 + 0x28) + 0x18);
                      if (lVar16 != 0) {
                        lVar17 = 0;
                        do {
                          if ((*(uint *)(*(long *)(lVar20 + lVar17) + 0x10) | 2) != 3)
                          goto LAB_002fc6fe;
                          lVar17 = lVar17 + 8;
                        } while (lVar16 * 8 != lVar17);
                      }
                    }
                  }
                  else {
                    CoreML::validateNdMultiArrayInputType
                              ((Result *)local_1f0,*(ArrayFeatureType **)(puVar18 + 0x18));
                    local_220 = (pointer)local_1f0;
                    std::__cxx11::string::operator=((string *)&local_218,(string *)&local_1e8);
                    bVar22 = CoreML::Result::good((Result *)&local_220);
                    if (local_1e8._M_p != local_1e0 + 8) {
                      operator_delete(local_1e8._M_p,local_1e0._8_8_ + 1);
                    }
                    if (!bVar22) {
                      *(pointer *)__return_storage_ptr__ = local_220;
                      (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)local_1f8;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_218._M_p == &local_208) {
                        local_1f8->_M_allocated_capacity =
                             CONCAT71(local_208._M_allocated_capacity._1_7_,
                                      local_208._M_local_buf[0]);
                        *(undefined8 *)((long)local_1f8 + 8) = local_208._8_8_;
                      }
                      else {
                        (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_218._M_p;
                        (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
                             CONCAT71(local_208._M_allocated_capacity._1_7_,
                                      local_208._M_local_buf[0]);
                      }
                      (__return_storage_ptr__->m_message)._M_string_length = local_210;
                      local_210 = 0;
                      local_208._M_local_buf[0] = '\0';
                      local_218._M_p = (pointer)&local_208;
                      goto LAB_002fcb25;
                    }
                  }
                }
                pVVar19 = pVVar19 + 2;
              } while (pVVar19 != local_150);
            }
            CoreML::NeuralNetworkSpecValidator::NeuralNetworkSpecValidator
                      ((NeuralNetworkSpecValidator *)local_1f0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&local_60,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)&local_90,bVar21,0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)&local_90);
            CoreML::NeuralNetworkSpecValidator::
            validateNeuralNetwork<CoreML::Specification::NeuralNetworkClassifier>
                      ((Result *)local_118,(NeuralNetworkSpecValidator *)local_1f0,nn);
            local_220 = (pointer)local_118;
            std::__cxx11::string::operator=((string *)&local_218,(string *)&local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_p != local_100) {
              operator_delete(local_110._M_p,local_100[0]._M_allocated_capacity + 1);
            }
            bVar22 = CoreML::Result::good((Result *)&local_220);
            if (bVar22) {
              p_Var3 = &local_188._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)local_188._M_impl.super__Rb_tree_header._M_header._M_left !=
                  p_Var3) {
                p_Var15 = local_188._M_impl.super__Rb_tree_header._M_header._M_left;
                do {
                  iVar14 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           ::find(&local_60,(key_type *)(p_Var15 + 1));
                  if (((_Rb_tree_header *)iVar14._M_node == p_Var2) ||
                     ((_Base_ptr)0x1 < p_Var15[3]._M_parent)) {
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              (local_140,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (p_Var15 + 1));
                  }
                  p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
                } while ((_Rb_tree_header *)p_Var15 != p_Var3);
              }
              if (bVar21 == false) {
                CoreML::NeuralNetworkShaper::NeuralNetworkShaper
                          ((NeuralNetworkShaper *)local_118,interface,&nn->layers_,true);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                ::~_Rb_tree(&local_e0);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                             *)&local_110);
              }
              bVar21 = CoreML::Result::good((Result *)&local_220);
              if ((bVar21) && ((char)local_144 != '\0')) {
                validateUpdatableNeuralNetwork<CoreML::Specification::NeuralNetworkClassifier>
                          ((Result *)local_118,nn);
                local_220 = (pointer)local_118;
                std::__cxx11::string::operator=((string *)&local_218,(string *)&local_110);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_p != local_100) {
                  operator_delete(local_110._M_p,local_100[0]._M_allocated_capacity + 1);
                }
                bVar21 = CoreML::Result::good((Result *)&local_220);
                if (bVar21) {
                  validateTrainingInputs<CoreML::Specification::NeuralNetworkClassifier>
                            ((Result *)local_118,interface,nn);
                  local_220 = (pointer)local_118;
                  std::__cxx11::string::operator=((string *)&local_218,(string *)&local_110);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_110._M_p != local_100) {
                    operator_delete(local_110._M_p,local_100[0]._M_allocated_capacity + 1);
                  }
                  CoreML::Result::good((Result *)&local_220);
                }
              }
            }
            *(pointer *)__return_storage_ptr__ = local_220;
            (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)local_1f8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_p == &local_208) {
              local_1f8->_M_allocated_capacity =
                   CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]);
              *(undefined8 *)((long)local_1f8 + 8) = local_208._8_8_;
            }
            else {
              (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_218._M_p;
              (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
                   CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]);
            }
            (__return_storage_ptr__->m_message)._M_string_length = local_210;
            local_210 = 0;
            local_208._M_local_buf[0] = '\0';
            local_218._M_p = (pointer)&local_208;
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::~_Rb_tree(&local_188);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)(local_1d0 + 0x18));
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)&local_1e8);
LAB_002fcb25:
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::~_Rb_tree(&local_60);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~_Rb_tree(&local_90);
          }
          goto LAB_002fcaaf;
        }
        local_1f0 = (undefined1  [8])local_1e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f0,"Neural networks require at least one layer.","");
        CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1f0);
      }
    }
    else {
      local_1f0 = (undefined1  [8])local_1e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f0,
                 "Neural Network Multi-Array input shape mapping cannot be \'RANK5_ARRAY_MAPPING\' if the image input Shape mapping is not \'RANK5_IMAGE_MAPPING\'"
                 ,"");
      CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_1f0);
    }
  }
  else {
    lVar20 = 0;
    do {
      bVar22 = CoreML::isIOS12NeuralNetworkLayer(*(NeuralNetworkLayer **)((long)ppvVar11 + lVar20));
      bVar23 = lVar16 * 8 + -8 != lVar20;
      lVar20 = lVar20 + 8;
    } while (bVar22 && bVar23);
    if ((bool)(iVar4 != 0 | bVar21) || bVar22) {
      bVar22 = iVar5 == 0 && bVar22;
      goto LAB_002fc2df;
    }
    local_1f0 = (undefined1  [8])local_1e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,
               "Neural Network Multi-Array input shape mapping cannot be \'RANK5_ARRAY_MAPPING\' if the network contains a layer added in version 4 (iOS 13) or later. Use \'EXACT_ARRAY_MAPPING\' instead."
               ,"");
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_1f0);
  }
LAB_002fca98:
  if (local_1f0 != (undefined1  [8])local_1e0) {
    operator_delete((void *)local_1f0,local_1e0._0_8_ + 1);
  }
LAB_002fcaaf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_p != &local_208) {
    operator_delete(local_218._M_p,
                    CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateNeuralNetworkTopLevel(const Specification::ModelDescription& interface,
                                     const T& nn, std::set<std::string>& outputBlobNames,
                                     bool isUpdatable,
                                     const ValidationPolicy& validationPolicy) {
    Result r;

    // First calculate the value of the flag "ndArrayInterpretation"
    // ndArrayInterpretation == False ==> iOS 11/12 (old) execution path can be used, i.e. all tensors are static rank 5.
    // ndArrayInterpretation == True ==>  Tensors can have any rank (including 5).

    bool ndArrayInterpretation = false;

    bool hasNonIOS12Layer = false;
    bool hasNewArrayShapeMapping = false;
    bool hasNewImageShapeMapping = false;
    bool hasMultiArrayInput = false;

    for (const auto& input: interface.input()) {
        if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            hasMultiArrayInput = true;
            break;
        }
    }

    if (nn.arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
        hasNewArrayShapeMapping = true;
    }

    if (nn.imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
        hasNewImageShapeMapping = true;
    }

    for (const auto &layer: nn.layers()) {
        if (!isIOS12NeuralNetworkLayer(layer)) {
            hasNonIOS12Layer = true;
            break;
        }
    }

    if (hasNonIOS12Layer || hasNewArrayShapeMapping || hasNewImageShapeMapping) {
        ndArrayInterpretation = true;
    }

    if (hasNonIOS12Layer && !hasNewArrayShapeMapping && hasMultiArrayInput) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural Network Multi-Array input shape mapping cannot be 'RANK5_ARRAY_MAPPING' if the network contains a layer added in version 4 (iOS 13) or later. Use 'EXACT_ARRAY_MAPPING' instead.");
    }

    if (!hasNewArrayShapeMapping && hasNewImageShapeMapping && hasMultiArrayInput) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural Network Multi-Array input shape mapping cannot be 'RANK5_ARRAY_MAPPING' if the image input Shape mapping is not 'RANK5_IMAGE_MAPPING'");
    }

    //==================== End of logic to determine the value of "ndArrayInterpretation" ======================

    if (!validationPolicy.allowsEmptyInput && interface.input_size() == 0) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural networks require at least one input.");
    }

    if (interface.output_size() == 0) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural networks produce at least one output.");
    }

    if (nn.layers().size() == 0) {
        return Result(ResultType::INVALID_MODEL_PARAMETERS,
                      "Neural networks require at least one layer.");
    }

    if (interface.input_size() > 0 && std::all_of(interface.input().begin(), interface.input().end(),
                    [](const Specification::FeatureDescription& input) {
                        if (input.type().Type_case() == Specification::FeatureType::kStateType)
                            return true; // ignores optionality for State type (which is always non-optional).
                        else
                            return input.type().isoptional();
                    })) {
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Neural networks require at least one non-optional input.");
                    }

    // Check the input types
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputTypes(interface.input(), ResultReason::MODEL_INPUT_TYPE_INVALID, "inputs"));

    std::map<std::string, int> ioBlobNameToRank; // to collect ranks of input/output blobs from the shapes present in the description

    // populate "ioBlobNameToRank"
    if (ndArrayInterpretation) {
        for (const auto& input: interface.input()) {
            if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
                if (nn.arrayinputshapemapping() == Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                    ioBlobNameToRank[input.name()] = 5;
                } else {
                    ioBlobNameToRank[input.name()] = input.type().multiarraytype().shape_size();
                }
            } else if (input.type().Type_case() == Specification::FeatureType::kImageType) {
                if (nn.imageinputshapemapping() == Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                    ioBlobNameToRank[input.name()] = 5;
                } else {
                    ioBlobNameToRank[input.name()] = 4;
                }
            }
        }
        for (const auto& output: interface.output()) {
            if (output.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
                if (output.type().multiarraytype().shape_size()) {
                    ioBlobNameToRank[output.name()] = output.type().multiarraytype().shape_size();
                }
            }
        }
    }

    // Collect Model input names and do some checking

    // inputBlobs: For each named data blob, the name of the node which produced it (there can be multiple in if-else branches)
    std::map<std::string, std::set<std::string>> inputBlobs;
    for (const auto& input: interface.input()) {
        // For input blobs, we'll give them a dummy producing layer name
        inputBlobs[input.name()] = {"__input"};
        if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {

            if (!ndArrayInterpretation) {

                // only vector-like (rank 1) or image-like (rank 3) inputs are allowed
                bool validShapeFound = false;
                if (input.type().multiarraytype().shape().size() > 0) {
                    if (!(input.type().multiarraytype().shape().size() == 1
                          || input.type().multiarraytype().shape().size() == 3)) {
                        return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                    }
                    else {
                        validShapeFound = true;
                    }
                }
                bool flexibilityIsRank1or3 = true;
                switch (input.type().multiarraytype().ShapeFlexibility_case()) {
                    case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes:
                        for (const auto &shape : input.type().multiarraytype().enumeratedshapes().shapes()) {
                            if(shape.shape_size() != 1 && shape.shape_size() != 3) {
                                flexibilityIsRank1or3 = false;
                                break;
                            }
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kShapeRange:
                        flexibilityIsRank1or3 = (input.type().multiarraytype().shaperange().sizeranges_size() == 1 ||
                                                 input.type().multiarraytype().shaperange().sizeranges_size() == 3);
                        break;
                    case CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                        flexibilityIsRank1or3 = false;
                        break;
                }
                if (!flexibilityIsRank1or3 && !validShapeFound) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                } else if (flexibilityIsRank1or3) {
                    validShapeFound = true;
                }
                if (!validShapeFound) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                }

            } else { // validate input shape when "ndArrayInterpretation" is True

                if (!(r = validateNdMultiArrayInputType(input.type().multiarraytype())).good()) {
                    return r;
                }
            } // if else block on spec version to check validity of input shape
        }
    }

    // validate the Neural Network message

    //  create an object to validate neural network message
    NeuralNetworkSpecValidator validator(inputBlobs, ioBlobNameToRank, ndArrayInterpretation, 0, ioBlobNameToRank);

    r = validator.validateNeuralNetwork(nn);

    if (!r.good()) {
        return r;
    }

    // gather all output blobs of the graph
    for (auto& blob: validator.blobs){
        if (inputBlobs.find(blob.first) == inputBlobs.end()) {
            outputBlobNames.insert(blob.first);
        } else {
            // if we are here, this means this blob is also present in the set of "inputBlobs"
            // but it can still be a genuine output blob if multiple layers are generating it (e.g. copy layer)
            if (blob.second.size() > 1) {
                outputBlobNames.insert(blob.first);
            }
        }
    }

    // Call the shaper: compatibility with iOS 12
    if (!ndArrayInterpretation) {
        // Compute the shapes
        try {
            NeuralNetworkShaper shaper(interface, nn.layers());
        }
        catch(std::runtime_error& e) {
            std::string err = std::string("Error determining network blob shapes: ") + std::string(e.what());
            return Result(ResultType::POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES, err);
        }
    }

    if (!r.good()) {
        return r;
    }

    if (isUpdatable) {
        r = validateUpdatableNeuralNetwork(nn);
        if (!r.good()) { return r; }

        r = validateTrainingInputs(interface, nn);
        if (!r.good()) { return r; }
    }

    return r;

}